

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-predicate.c
# Opt level: O3

_Bool monster_is_decoyed(monster *mon)

{
  _Bool _Var1;
  loc grid;
  
  grid = cave_find_decoy(cave);
  _Var1 = loc_is_zero((loc_conflict)grid);
  if (_Var1) {
    return false;
  }
  _Var1 = los(cave,mon->grid,(loc_conflict)grid);
  return _Var1;
}

Assistant:

bool monster_is_decoyed(const struct monster *mon)
{
	struct loc decoy = cave_find_decoy(cave);

	/* No decoy */
	if (loc_is_zero(decoy)) return false;

	/* Monster can't see the decoy */
	if (!los(cave, mon->grid, decoy)) return false;

	return true;
}